

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

MIPMap * pbrt::ImageTextureBase::GetTexture
                   (string *filename,string *filter,Float maxAniso,WrapMode wrap,
                   ColorEncodingHandle *encoding,Allocator alloc)

{
  unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> __p;
  iterator iVar1;
  mapped_type *pmVar2;
  FilterFunction *pFVar3;
  __uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *this;
  MIPMap *pMVar4;
  unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> mipmap;
  optional<pbrt::FilterFunction> ff;
  MIPMapFilterOptions local_a8;
  unique_lock<std::mutex> lock;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_90;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_88;
  TexInfo texInfo;
  
  local_88.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  TexInfo::TexInfo(&texInfo,filename,filter,maxAniso,wrap,(ColorEncodingHandle *)&local_88);
  std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)textureCacheMutex);
  iVar1 = std::
          _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
          ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                  *)textureCache,&texInfo);
  if (iVar1._M_node == (_Base_ptr)(textureCache + 8)) {
    std::unique_lock<std::mutex>::unlock(&lock);
    local_a8.filter = EWA;
    local_a8.maxAnisotropy = maxAniso;
    ParseFilter((pbrt *)&ff,filter);
    if (ff.set == true) {
      pFVar3 = pstd::optional<pbrt::FilterFunction>::value(&ff);
      local_a8.filter = *pFVar3;
    }
    else {
      Warning<std::__cxx11::string_const&>("%s: filter function unknown",filter);
    }
    local_90.bits =
         (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
    MIPMap::CreateFromFile
              ((MIPMap *)&mipmap,filename,&local_a8,wrap,(ColorEncodingHandle *)&local_90,alloc);
    if ((__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>)
        mipmap._M_t.super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>._M_t.
        super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
        super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>)0x0) {
      pMVar4 = (MIPMap *)0x0;
    }
    else {
      std::unique_lock<std::mutex>::lock(&lock);
      iVar1 = std::
              _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
              ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                      *)textureCache,&texInfo);
      if (iVar1._M_node != (_Base_ptr)(textureCache + 8)) {
        LogFatal<char_const(&)[49]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                   ,0x19c,"Check failed: %s",
                   (char (*) [49])"textureCache.find(texInfo) == textureCache.end()");
      }
      this = (__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
             std::
             map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
             ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                           *)textureCache,&texInfo);
      __p = mipmap;
      mipmap._M_t.super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
      super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl =
           (__uniq_ptr_data<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>,_true,_true>)
           (__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>)0x0;
      std::__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::reset
                (this,(pointer)__p._M_t.
                               super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>
                               .super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl);
      pmVar2 = std::
               map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
               ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                             *)textureCache,&texInfo);
      pMVar4 = (pmVar2->_M_t).
               super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>._M_t.
               super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
               super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl;
    }
    std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::~unique_ptr(&mipmap);
    pstd::optional<pbrt::FilterFunction>::~optional(&ff);
  }
  else {
    pmVar2 = std::
             map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
             ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                           *)textureCache,&texInfo);
    pMVar4 = (pmVar2->_M_t).super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>.
             _M_t.super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
             super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl;
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  TexInfo::~TexInfo(&texInfo);
  return pMVar4;
}

Assistant:

MIPMap *ImageTextureBase::GetTexture(const std::string &filename,
                                     const std::string &filter, Float maxAniso,
                                     WrapMode wrap, ColorEncodingHandle encoding,
                                     Allocator alloc) {
    // Return _MIPMap_ from texture cache if present
    TexInfo texInfo(filename, filter, maxAniso, wrap, encoding);
    std::unique_lock<std::mutex> lock(textureCacheMutex);
    if (textureCache.find(texInfo) != textureCache.end())
        return textureCache[texInfo].get();
    else
        lock.unlock();

    // Create _MIPMap_ for _filename_
    MIPMapFilterOptions options;
    options.maxAnisotropy = maxAniso;

    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        options.filter = *ff;
    else
        Warning("%s: filter function unknown", filter);

    std::unique_ptr<MIPMap> mipmap =
        MIPMap::CreateFromFile(filename, options, wrap, encoding, alloc);
    if (mipmap) {
        lock.lock();
        // This is actually ok, but if it hits, it means we've wastefully
        // loaded this texture. (Note that in that case, should just return
        // the one that's already in there and not replace it.)
        CHECK(textureCache.find(texInfo) == textureCache.end());
        textureCache[texInfo] = std::move(mipmap);

        return textureCache[texInfo].get();
    } else
        return nullptr;
}